

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O1

Book * __thiscall
Library::checkout_book(Book *__return_storage_ptr__,Library *this,Patron *patron,string *isbn)

{
  Book *pBVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  undefined8 uVar5;
  size_type *psVar6;
  Book *this_00;
  bool bVar7;
  string local_88;
  Book *local_68;
  Library *local_60;
  Patron *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = *(Book **)&this->books;
  pBVar1 = *(Book **)&this->field_0x20;
  local_68 = __return_storage_ptr__;
  local_60 = this;
  local_58 = patron;
  do {
    bVar2 = this_00 != pBVar1;
    if (!bVar2) {
LAB_00113eba:
      std::operator+(&local_50,"Error in Library::checkout_book() - Book with ISBN=",isbn);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_88._M_dataplus._M_p = (pointer)*plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar6) {
        local_88.field_2._M_allocated_capacity = *psVar6;
        local_88.field_2._8_8_ = plVar4[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar6;
      }
      local_88._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      error(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      uVar5 = std::__cxx11::string::~string((string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar5);
    }
    Book::get_isbn_abi_cxx11_(&local_88,this_00);
    if (local_88._M_string_length == isbn->_M_string_length) {
      if (local_88._M_string_length == 0) {
        bVar7 = true;
      }
      else {
        iVar3 = bcmp(local_88._M_dataplus._M_p,(isbn->_M_dataplus)._M_p,local_88._M_string_length);
        bVar7 = iVar3 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      checkout_book(local_68,local_60,local_58,this_00);
      if (bVar2) {
        return local_68;
      }
      goto LAB_00113eba;
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

Book Library::checkout_book(const Patron& patron, const std::string& isbn)
{
	for (const auto& book : books)
		if (book.get_isbn() == isbn)
			return checkout_book(patron, book);
	error("Error in Library::checkout_book() - Book with ISBN="
		+ isbn + " not found.");
}